

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# SyntaxTree.cpp
# Opt level: O0

void __thiscall
slang::syntax::SyntaxTree::SyntaxTree
          (SyntaxTree *this,SyntaxNode *root,SourceManager *sourceManager,BumpAllocator *alloc,
          Diagnostics *diagnostics,ParserMetadata *metadata,
          vector<const_slang::syntax::DefineDirectiveSyntax_*,_std::allocator<const_slang::syntax::DefineDirectiveSyntax_*>_>
          *macros,Bag *options)

{
  ParserMetadata *metadata_local;
  Diagnostics *diagnostics_local;
  BumpAllocator *alloc_local;
  SourceManager *sourceManager_local;
  SyntaxNode *root_local;
  SyntaxTree *this_local;
  
  this->isLibrary = false;
  this->rootNode = root;
  this->sourceMan = sourceManager;
  BumpAllocator::BumpAllocator(&this->alloc,alloc);
  Diagnostics::Diagnostics(&this->diagnosticsBuffer,diagnostics);
  Bag::Bag(&this->options_,options);
  std::make_unique<slang::parsing::ParserMetadata,slang::parsing::ParserMetadata>
            ((ParserMetadata *)&this->metadata);
  std::
  vector<const_slang::syntax::DefineDirectiveSyntax_*,_std::allocator<const_slang::syntax::DefineDirectiveSyntax_*>_>
  ::vector(&this->macros,macros);
  std::shared_ptr<slang::syntax::SyntaxTree>::shared_ptr(&this->parentTree);
  return;
}

Assistant:

SyntaxTree::SyntaxTree(SyntaxNode* root, SourceManager& sourceManager, BumpAllocator&& alloc,
                       Diagnostics&& diagnostics, ParserMetadata&& metadata,
                       std::vector<const DefineDirectiveSyntax*>&& macros, Bag options) :
    rootNode(root),
    sourceMan(sourceManager), alloc(std::move(alloc)), diagnosticsBuffer(std::move(diagnostics)),
    options_(std::move(options)), metadata(std::make_unique<ParserMetadata>(std::move(metadata))),
    macros(std::move(macros)) {
}